

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DiagObjectModel.cpp
# Opt level: O0

uint32 __thiscall
Js::RecyclableArgumentsArrayWalker::GetChildrenCount(RecyclableArgumentsArrayWalker *this)

{
  code *pcVar1;
  bool bVar2;
  uint32 uVar3;
  BOOL BVar4;
  undefined4 *puVar5;
  ArenaAllocator *alloc;
  List<Js::DebuggerPropertyDisplayInfo_*,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
  *pLVar6;
  ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL> *pAVar7;
  DebuggerPropertyDisplayInfo *this_00;
  uint32 local_9c;
  TrackAllocData local_68;
  DebuggerPropertyDisplayInfo *local_40;
  DebuggerPropertyDisplayInfo *info;
  Var itemObj;
  ArrayObject *pAStack_28;
  uint32 index;
  ArrayObject *objectArray;
  DynamicObject *pDStack_18;
  uint32 totalCount;
  ArgumentsObject *argObj;
  RecyclableArgumentsArrayWalker *this_local;
  
  argObj = (ArgumentsObject *)this;
  if ((this->super_RecyclableArrayWalker).super_RecyclableObjectWalker.pMembersList ==
      (List<Js::DebuggerPropertyDisplayInfo_*,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
       *)0x0) {
    bVar2 = VarIs<Js::ArgumentsObject>
                      ((this->super_RecyclableArrayWalker).super_RecyclableObjectWalker.instance);
    if (!bVar2) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar5 = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Debug/DiagObjectModel.cpp"
                                  ,0xc1a,"(Js::VarIs<Js::ArgumentsObject>(instance))",
                                  "Js::VarIs<Js::ArgumentsObject>(instance)");
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar5 = 0;
    }
    pDStack_18 = (DynamicObject *)
                 (this->super_RecyclableArrayWalker).super_RecyclableObjectWalker.instance;
    alloc = GetArenaFromContext((this->super_RecyclableArrayWalker).super_RecyclableObjectWalker.
                                scriptContext);
    pLVar6 = JsUtil::
             List<Js::DebuggerPropertyDisplayInfo_*,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
             ::New(alloc,4);
    (this->super_RecyclableArrayWalker).super_RecyclableObjectWalker.pMembersList = pLVar6;
    if ((this->super_RecyclableArrayWalker).super_RecyclableObjectWalker.pMembersList ==
        (List<Js::DebuggerPropertyDisplayInfo_*,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
         *)0x0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar5 = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Debug/DiagObjectModel.cpp"
                                  ,0xc1e,"(pMembersList)","pMembersList");
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar5 = 0;
    }
    objectArray._4_4_ =
         (*(pDStack_18->super_RecyclableObject).super_FinalizableObject.super_IRecyclerVisitedObject
           ._vptr_IRecyclerVisitedObject[0x6b])();
    pAStack_28 = DynamicObject::GetObjectArray(pDStack_18);
    if ((pAStack_28 != (ArrayObject *)0x0) &&
       (uVar3 = ArrayObject::GetLength(pAStack_28), objectArray._4_4_ < uVar3)) {
      objectArray._4_4_ = ArrayObject::GetLength(pAStack_28);
    }
    for (itemObj._4_4_ = 0; itemObj._4_4_ < objectArray._4_4_; itemObj._4_4_ = itemObj._4_4_ + 1) {
      BVar4 = RecyclableObject::GetItem
                        (&pDStack_18->super_RecyclableObject,pDStack_18,itemObj._4_4_,&info,
                         (this->super_RecyclableArrayWalker).super_RecyclableObjectWalker.
                         scriptContext);
      if (BVar4 != 0) {
        pAVar7 = &GetArenaFromContext((this->super_RecyclableArrayWalker).
                                      super_RecyclableObjectWalker.scriptContext)->
                  super_ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>;
        Memory::TrackAllocData::CreateTrackAllocData
                  (&local_68,(type_info *)&DebuggerPropertyDisplayInfo::typeinfo,0,
                   0xffffffffffffffff,
                   "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Debug/DiagObjectModel.cpp"
                   ,0xc2c);
        pAVar7 = Memory::ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>::
                 TrackAllocInfo(pAVar7,&local_68);
        this_00 = (DebuggerPropertyDisplayInfo *)
                  new<Memory::ArenaAllocator>(0x18,(ArenaAllocator *)pAVar7,0x3f67b0);
        DebuggerPropertyDisplayInfo::DebuggerPropertyDisplayInfo(this_00,itemObj._4_4_,info,0);
        local_40 = this_00;
        if (this_00 == (DebuggerPropertyDisplayInfo *)0x0) {
          AssertCount = AssertCount + 1;
          Throw::LogAssert();
          puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar5 = 1;
          bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Debug/DiagObjectModel.cpp"
                                      ,0xc2d,"(info)","info");
          if (!bVar2) {
            pcVar1 = (code *)invalidInstructionException();
            (*pcVar1)();
          }
          puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar5 = 0;
        }
        JsUtil::
        List<Js::DebuggerPropertyDisplayInfo_*,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
        ::Add((this->super_RecyclableArrayWalker).super_RecyclableObjectWalker.pMembersList,
              &local_40);
      }
    }
  }
  if ((this->super_RecyclableArrayWalker).super_RecyclableObjectWalker.pMembersList ==
      (List<Js::DebuggerPropertyDisplayInfo_*,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
       *)0x0) {
    local_9c = 0;
  }
  else {
    local_9c = JsUtil::
               ReadOnlyList<Js::DebuggerPropertyDisplayInfo_*,_Memory::ArenaAllocator,_DefaultComparer>
               ::Count(&((this->super_RecyclableArrayWalker).super_RecyclableObjectWalker.
                        pMembersList)->
                        super_ReadOnlyList<Js::DebuggerPropertyDisplayInfo_*,_Memory::ArenaAllocator,_DefaultComparer>
                      );
  }
  return local_9c;
}

Assistant:

uint32 RecyclableArgumentsArrayWalker::GetChildrenCount()
    {
        if (pMembersList == nullptr)
        {
            Assert(Js::VarIs<Js::ArgumentsObject>(instance));
            Js::ArgumentsObject * argObj = static_cast<Js::ArgumentsObject*>(instance);

            pMembersList = JsUtil::List<DebuggerPropertyDisplayInfo *, ArenaAllocator>::New(GetArenaFromContext(scriptContext));
            Assert(pMembersList);

            uint32 totalCount = argObj->GetNumberOfArguments();
            Js::ArrayObject * objectArray = argObj->GetObjectArray();
            if (objectArray != nullptr && objectArray->GetLength() > totalCount)
            {
                totalCount = objectArray->GetLength();
            }

            for (uint32 index = 0; index < totalCount; index++)
            {
                Var itemObj;
                if (argObj->GetItem(argObj, index, &itemObj, scriptContext))
                {
                    DebuggerPropertyDisplayInfo *info = Anew(GetArenaFromContext(scriptContext), DebuggerPropertyDisplayInfo, index, itemObj, DebuggerPropertyDisplayInfoFlags_None);
                    Assert(info);
                    pMembersList->Add(info);
                }
            }
       }

        return pMembersList ? pMembersList->Count() : 0;
    }